

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_paste(_glist *x)

{
  void *data;
  _gobj *p_Var1;
  int d_offset;
  t_selection *ptVar2;
  int y0;
  int x0;
  int local_20;
  int local_1c;
  
  if (x->gl_editor != (t_editor *)0x0) {
    if (x->gl_editor->e_textedfor != (_rtext *)0x0) {
      pdgui_vmess("pdtk_pastetext","^",x);
      return;
    }
    d_offset = 0;
    local_1c = 0;
    local_20 = 0;
    binbuf_getpos(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor,&local_1c,&local_20,
                  (t_symbol **)0x0);
    if (x->gl_list != (t_gobj *)0x0) {
      d_offset = 0;
      do {
        p_Var1 = x->gl_list;
        while ((local_1c + d_offset != (int)*(short *)&p_Var1[2].g_next ||
               (local_20 + d_offset != (int)*(short *)((long)&p_Var1[2].g_next + 2)))) {
          p_Var1 = p_Var1->g_next;
          if (p_Var1 == (_gobj *)0x0) goto LAB_00142cca;
        }
        d_offset = d_offset + 10;
      } while( true );
    }
LAB_00142cca:
    data = canvas_undo_set_paste(x,0,0,d_offset);
    canvas_undo_add(x,UNDO_PASTE,"paste",data);
    canvas_dopaste(x,*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
    if (d_offset != 0) {
      for (ptVar2 = x->gl_editor->e_selection; ptVar2 != (t_selection *)0x0;
          ptVar2 = ptVar2->sel_next) {
        gobj_displace(ptVar2->sel_what,x,d_offset,d_offset);
      }
    }
  }
  return;
}

Assistant:

static void canvas_paste(t_canvas *x)
{
    if (!x->gl_editor)
        return;
    if (x->gl_editor->e_textedfor)
    {
            /* simulate keystrokes as if the copy buffer were typed in. */
        pdgui_vmess("pdtk_pastetext", "^", x);
    }
    else
    {
        int offset = 0;
        int x0 = 0, y0 = 0;
        int foundplace = 0;
        binbuf_getpos(EDITOR->copy_binbuf, &x0, &y0, 0);
        do {
                /* iterate over all existing objects
                 * to see whether one occupies the space we want.
                 * if so, move along
                 */
            t_gobj *y;
            foundplace = 1;
            for (y = x->gl_list; y; y = y->g_next) {
                t_text *txt = (t_text *)y;
                if((x0 + offset) == txt->te_xpix && (y0 + offset) == txt->te_ypix)
                {
                    foundplace = 0;
                    offset += PASTE_OFFSET;
                    break;
                }
            }
        } while(!foundplace);
        canvas_undo_add(x, UNDO_PASTE, "paste",
            (void *)canvas_undo_set_paste(x, 0, 0, offset));
        canvas_dopaste(x, EDITOR->copy_binbuf);
        if(offset)
        {
            t_selection *y;
            for (y = x->gl_editor->e_selection; y; y = y->sel_next)
                gobj_displace(y->sel_what, x,
                    offset, offset);
        }
    }
}